

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddText(ImDrawList *this,ImFont *font,float font_size,ImVec2 *pos,ImU32 col,
                   char *text_begin,char *text_end,float wrap_width,ImVec4 *cpu_fine_clip_rect)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  ImVec4 clip_rect;
  ImVec4 local_48;
  float local_30;
  float local_2c;
  
  if (0xffffff < col) {
    if (text_end == (char *)0x0) {
      local_30 = font_size;
      local_2c = wrap_width;
      sVar1 = strlen(text_begin);
      text_end = text_begin + sVar1;
      font_size = local_30;
      wrap_width = local_2c;
    }
    if (text_end != text_begin) {
      if (font == (ImFont *)0x0) {
        font = this->_Data->Font;
      }
      if ((font_size == 0.0) && (!NAN(font_size))) {
        font_size = this->_Data->FontSize;
      }
      if (font->ContainerAtlas->TexID != (this->_CmdHeader).TextureId) {
        __assert_fail("font->ContainerAtlas->TexID == _CmdHeader.TextureId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0x62a,
                      "void ImDrawList::AddText(const ImFont *, float, const ImVec2 &, ImU32, const char *, const char *, float, const ImVec4 *)"
                     );
      }
      local_48.x = (this->_CmdHeader).ClipRect.x;
      local_48.y = (this->_CmdHeader).ClipRect.y;
      local_48.z = (this->_CmdHeader).ClipRect.z;
      local_48.w = (this->_CmdHeader).ClipRect.w;
      if (cpu_fine_clip_rect != (ImVec4 *)0x0) {
        uVar2 = -(uint)(cpu_fine_clip_rect->x <= local_48.x);
        uVar3 = -(uint)(cpu_fine_clip_rect->y <= local_48.y);
        local_48.y = (float)(~uVar3 & (uint)cpu_fine_clip_rect->y | (uint)local_48.y & uVar3);
        local_48.x = (float)(~uVar2 & (uint)cpu_fine_clip_rect->x | (uint)local_48.x & uVar2);
        if (cpu_fine_clip_rect->z <= local_48.z) {
          local_48.z = cpu_fine_clip_rect->z;
        }
        if (cpu_fine_clip_rect->w <= local_48.w) {
          local_48.w = cpu_fine_clip_rect->w;
        }
      }
      ImFont::RenderText(font,this,font_size,*pos,col,&local_48,text_begin,text_end,wrap_width,
                         cpu_fine_clip_rect != (ImVec4 *)0x0);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddText(const ImFont* font, float font_size, const ImVec2& pos, ImU32 col, const char* text_begin, const char* text_end, float wrap_width, const ImVec4* cpu_fine_clip_rect)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (text_end == NULL)
        text_end = text_begin + strlen(text_begin);
    if (text_begin == text_end)
        return;

    // Pull default font/size from the shared ImDrawListSharedData instance
    if (font == NULL)
        font = _Data->Font;
    if (font_size == 0.0f)
        font_size = _Data->FontSize;

    IM_ASSERT(font->ContainerAtlas->TexID == _CmdHeader.TextureId);  // Use high-level ImGui::PushFont() or low-level ImDrawList::PushTextureId() to change font.

    ImVec4 clip_rect = _CmdHeader.ClipRect;
    if (cpu_fine_clip_rect)
    {
        clip_rect.x = ImMax(clip_rect.x, cpu_fine_clip_rect->x);
        clip_rect.y = ImMax(clip_rect.y, cpu_fine_clip_rect->y);
        clip_rect.z = ImMin(clip_rect.z, cpu_fine_clip_rect->z);
        clip_rect.w = ImMin(clip_rect.w, cpu_fine_clip_rect->w);
    }
    font->RenderText(this, font_size, pos, col, clip_rect, text_begin, text_end, wrap_width, cpu_fine_clip_rect != NULL);
}